

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

char hunyise_main_huase(void)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  __node_base *p_Var6;
  
  uVar3 = 0;
  p_Var6 = &my_active_card_abi_cxx11_._M_h._M_before_begin;
  uVar4 = 0;
  uVar5 = 0;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    cVar1 = *(char *)&(p_Var6[1]._M_nxt)->_M_nxt;
    uVar4 = uVar4 + (cVar1 == 'W');
    uVar3 = uVar3 + (cVar1 == 'B');
    uVar5 = uVar5 + (cVar1 == 'T');
  }
  cVar1 = 'B';
  if (uVar3 < uVar5) {
    cVar1 = 'T';
  }
  if ((int)uVar5 < (int)uVar3) {
    uVar5 = uVar3;
  }
  cVar2 = 'W';
  if (uVar4 < uVar5) {
    cVar2 = cVar1;
  }
  return cVar2;
}

Assistant:

char hunyise_main_huase() {
	int tiao = 0, bin = 0, wan = 0;
	for (auto it = my_active_card.begin(); it != my_active_card.end(); it++) {
		if (it->first[0] == 'W') wan++;
		if (it->first[0] == 'B') bin++;
		if (it->first[0] == 'T') tiao++;
	}
	char max = 'n';
	int maxnum = 0;
	if (tiao >= maxnum) {
		max = 'T';
		maxnum = tiao;
	}
	if (bin >= maxnum) {
		max = 'B';
		maxnum = bin;
	}
	if (wan >= maxnum) {
		max = 'W';
		maxnum = wan;
	}
	return max;
}